

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int parse_codes(archive_read *a)

{
  void *pvVar1;
  int iVar2;
  Bool BVar3;
  int iVar4;
  rar_br *br_00;
  ulong uVar5;
  void *pvVar6;
  uint uVar7;
  uint local_94;
  uint new_size;
  void *new_window;
  rar_br *br;
  rar *rar;
  huffman_code precode;
  uint maxorder;
  uchar ppmd_flags;
  uchar zerocount;
  uchar bitlengths [20];
  int local_28;
  int r;
  int n;
  int val;
  int j;
  int i;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  br_00 = (rar_br *)((long)pvVar1 + 0x4f30);
  free_codes(a);
  *(uint *)((long)pvVar1 + 0x4f38) = *(uint *)((long)pvVar1 + 0x4f38) & 0xfffffff8;
  if (((*(int *)((long)pvVar1 + 0x4f38) < 1) && (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
     (*(int *)((long)pvVar1 + 0x4f38) < 1)) {
LAB_00165dba:
    archive_set_error(&a->archive,0x54,"Truncated RAR file data");
    *(undefined1 *)((long)pvVar1 + 0xd0) = 0;
    return -0x1e;
  }
  uVar5 = br_00->cache_buffer >> ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 1U & 0x3f);
  *(byte *)((long)pvVar1 + 0x3d2) = (byte)uVar5 & 1;
  if ((uVar5 & 1) == 0) {
    *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -1;
    if (((*(int *)((long)pvVar1 + 0x4f38) < 1) && (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
       (*(int *)((long)pvVar1 + 0x4f38) < 1)) goto LAB_00165dba;
    if ((br_00->cache_buffer >> ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 1U & 0x3f) &
        (ulong)1) == 0) {
      memset((void *)((long)pvVar1 + 0x1b8),0,0x194);
    }
    *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -1;
    memset(&maxorder,0,0x14);
    val = 0;
    iVar2 = val;
    while (val = iVar2, val < 0x14) {
      if (((*(int *)((long)pvVar1 + 0x4f38) < 4) && (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
         (*(int *)((long)pvVar1 + 0x4f38) < 4)) goto LAB_00165dba;
      *(byte *)((long)&maxorder + (long)val) =
           (byte)(br_00->cache_buffer >> ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 4U & 0x3f))
           & 0xf;
      *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -4;
      iVar2 = val + 1;
      if (*(char *)((long)&maxorder + (long)val) == '\x0f') {
        if (((*(int *)((long)pvVar1 + 0x4f38) < 4) && (iVar4 = rar_br_fillup(a,br_00), iVar4 == 0))
           && (*(int *)((long)pvVar1 + 0x4f38) < 4)) goto LAB_00165dba;
        uVar5 = br_00->cache_buffer >> ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 4U & 0x3f);
        precode.table._7_1_ = (byte)uVar5 & 0xf;
        *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -4;
        if ((uVar5 & 0xf) != 0) {
          for (n = 0; iVar2 = val, n < (int)(precode.table._7_1_ + 2) && val < 0x14; n = n + 1) {
            *(undefined1 *)((long)&maxorder + (long)val) = 0;
            val = val + 1;
          }
        }
      }
    }
    memset(&rar,0,0x28);
    iVar2 = create_code(a,(huffman_code *)&rar,(uchar *)&maxorder,0x14,'\x0f');
    if (iVar2 != 0) {
      free(rar);
      free((void *)precode._24_8_);
      return iVar2;
    }
    val = 0;
    while (val < 0x194) {
      iVar2 = read_next_symbol(a,(huffman_code *)&rar);
      if (iVar2 < 0) {
        free(rar);
        free((void *)precode._24_8_);
        return -0x1e;
      }
      if (iVar2 < 0x10) {
        *(byte *)((long)pvVar1 + (long)val + 0x1b8) =
             *(char *)((long)pvVar1 + (long)val + 0x1b8) + (char)iVar2 & 0xf;
        val = val + 1;
      }
      else if (iVar2 < 0x12) {
        if (val == 0) {
          free(rar);
          free((void *)precode._24_8_);
          archive_set_error(&a->archive,0x54,"Internal error extracting RAR file.");
          return -0x1e;
        }
        if (iVar2 == 0x10) {
          if (((*(int *)((long)pvVar1 + 0x4f38) < 3) && (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)
              ) && (*(int *)((long)pvVar1 + 0x4f38) < 3)) {
            free(rar);
            free((void *)precode._24_8_);
            goto LAB_00165dba;
          }
          local_28 = ((uint)(br_00->cache_buffer >>
                            ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 3U & 0x3f)) & 7) + 3;
          *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -3;
        }
        else {
          if (((*(int *)((long)pvVar1 + 0x4f38) < 7) && (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)
              ) && (*(int *)((long)pvVar1 + 0x4f38) < 7)) {
            free(rar);
            free((void *)precode._24_8_);
            goto LAB_00165dba;
          }
          local_28 = ((uint)(br_00->cache_buffer >>
                            ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 7U & 0x3f)) & 0x7f) +
                     0xb;
          *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -7;
        }
        for (n = 0; n < local_28 && val < 0x194; n = n + 1) {
          *(undefined1 *)((long)pvVar1 + (long)val + 0x1b8) =
               *(undefined1 *)((long)pvVar1 + (long)(val + -1) + 0x1b8);
          val = val + 1;
        }
      }
      else {
        if (iVar2 == 0x12) {
          if (((*(int *)((long)pvVar1 + 0x4f38) < 3) && (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)
              ) && (*(int *)((long)pvVar1 + 0x4f38) < 3)) {
            free(rar);
            free((void *)precode._24_8_);
            goto LAB_00165dba;
          }
          local_28 = ((uint)(br_00->cache_buffer >>
                            ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 3U & 0x3f)) & 7) + 3;
          *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -3;
        }
        else {
          if (((*(int *)((long)pvVar1 + 0x4f38) < 7) && (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)
              ) && (*(int *)((long)pvVar1 + 0x4f38) < 7)) {
            free(rar);
            free((void *)precode._24_8_);
            goto LAB_00165dba;
          }
          local_28 = ((uint)(br_00->cache_buffer >>
                            ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 7U & 0x3f)) & 0x7f) +
                     0xb;
          *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -7;
        }
        for (n = 0; n < local_28 && val < 0x194; n = n + 1) {
          *(undefined1 *)((long)pvVar1 + (long)val + 0x1b8) = 0;
          val = val + 1;
        }
      }
    }
    free(rar);
    free((void *)precode._24_8_);
    iVar2 = create_code(a,(huffman_code *)((long)pvVar1 + 0x118),(uchar *)((long)pvVar1 + 0x1b8),299
                        ,'\x0f');
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = create_code(a,(huffman_code *)((long)pvVar1 + 0x140),(uchar *)((long)pvVar1 + 0x2e3),
                        0x3c,'\x0f');
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = create_code(a,(huffman_code *)((long)pvVar1 + 0x168),(uchar *)((long)pvVar1 + 799),0x11,
                        '\x0f');
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = create_code(a,(huffman_code *)((long)pvVar1 + 400),(uchar *)((long)pvVar1 + 0x330),0x1c,
                        '\x0f');
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  else {
    *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -1;
    if (((*(int *)((long)pvVar1 + 0x4f38) < 7) && (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
       (*(int *)((long)pvVar1 + 0x4f38) < 7)) goto LAB_00165dba;
    uVar5 = br_00->cache_buffer >> ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 7U & 0x3f);
    precode.table._6_1_ = (byte)uVar5 & 0x7f;
    *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -7;
    if ((uVar5 & 0x20) != 0) {
      if (((*(int *)((long)pvVar1 + 0x4f38) < 8) && (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
         (*(int *)((long)pvVar1 + 0x4f38) < 8)) goto LAB_00165dba;
      *(uint *)((long)pvVar1 + 0xe8) =
           (((uint)(br_00->cache_buffer >>
                   ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 8U & 0x3f)) & 0xff) + 1) *
           0x100000;
      *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -8;
    }
    if ((precode.table._6_1_ & 0x40) == 0) {
      *(undefined4 *)((long)pvVar1 + 0x3d4) = 2;
    }
    else {
      if (((*(int *)((long)pvVar1 + 0x4f38) < 8) && (iVar2 = rar_br_fillup(a,br_00), iVar2 == 0)) &&
         (*(int *)((long)pvVar1 + 0x4f38) < 8)) goto LAB_00165dba;
      uVar7 = (uint)(br_00->cache_buffer >>
                    ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 8U & 0x3f)) & 0xff;
      *(uint *)((long)pvVar1 + 0x3f4) = uVar7;
      *(uint *)((long)pvVar1 + 0x3d4) = uVar7;
      *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -8;
    }
    if ((precode.table._6_1_ & 0x20) == 0) {
      if (*(char *)((long)pvVar1 + 0x3d0) == '\0') {
        archive_set_error(&a->archive,0x54,"Invalid PPMd sequence");
        return -0x1e;
      }
      BVar3 = PpmdRAR_RangeDec_Init((CPpmd7z_RangeDec *)((long)pvVar1 + 0x4ec8));
      if (BVar3 == 0) {
        archive_set_error(&a->archive,0x54,"Unable to initialize PPMd range decoder");
        return -0x1e;
      }
    }
    else {
      precode.table._0_4_ = (precode.table._6_1_ & 0x1f) + 1;
      if (0x10 < (uint)precode.table) {
        precode.table._0_4_ = ((precode.table._6_1_ & 0x1f) - 0xf) * 3 + 0x10;
      }
      if ((uint)precode.table == 1) {
        archive_set_error(&a->archive,0x54,"Truncated RAR file data");
        return -0x1e;
      }
      Ppmd7_Free((CPpmd7 *)((long)pvVar1 + 0x3d8));
      *(archive_read **)((long)pvVar1 + 0x4ef8) = a;
      *(code **)((long)pvVar1 + 0x4f00) = ppmd_read;
      PpmdRAR_RangeDec_CreateVTable((CPpmd7z_RangeDec *)((long)pvVar1 + 0x4ec8));
      *(long *)((long)pvVar1 + 0x4ef0) = (long)pvVar1 + 0x4ef8;
      Ppmd7_Construct((CPpmd7 *)((long)pvVar1 + 0x3d8));
      if (*(int *)((long)pvVar1 + 0xe8) == 0) {
        archive_set_error(&a->archive,0x54,"Invalid zero dictionary size");
        return -0x1e;
      }
      BVar3 = Ppmd7_Alloc((CPpmd7 *)((long)pvVar1 + 0x3d8),*(UInt32 *)((long)pvVar1 + 0xe8));
      if (BVar3 == 0) {
        archive_set_error(&a->archive,0xc,"Out of memory");
        return -0x1e;
      }
      BVar3 = PpmdRAR_RangeDec_Init((CPpmd7z_RangeDec *)((long)pvVar1 + 0x4ec8));
      if (BVar3 == 0) {
        archive_set_error(&a->archive,0x54,"Unable to initialize PPMd range decoder");
        return -0x1e;
      }
      Ppmd7_Init((CPpmd7 *)((long)pvVar1 + 0x3d8),(uint)precode.table);
      *(undefined1 *)((long)pvVar1 + 0x3d0) = 1;
    }
  }
  if ((*(int *)((long)pvVar1 + 0xe8) == 0) || (*(long *)((long)pvVar1 + 0x350) == 0)) {
    if (*(long *)((long)pvVar1 + 0x28) < 0x400000) {
      iVar2 = rar_fls((uint)*(undefined8 *)((long)pvVar1 + 0x28));
      local_94 = iVar2 << 1;
    }
    else {
      local_94 = 0x400000;
    }
    if (local_94 == 0) {
      archive_set_error(&a->archive,0x54,"Zero window size is invalid.");
      return -0x1e;
    }
    pvVar6 = realloc(*(void **)((long)pvVar1 + 0x350),(ulong)local_94);
    if (pvVar6 == (void *)0x0) {
      archive_set_error(&a->archive,0xc,"Unable to allocate memory for uncompressed data.");
      return -0x1e;
    }
    *(void **)((long)pvVar1 + 0x350) = pvVar6;
    *(uint *)((long)pvVar1 + 0xe8) = local_94;
    memset(*(void **)((long)pvVar1 + 0x350),0,(ulong)*(uint *)((long)pvVar1 + 0xe8));
    *(int *)((long)pvVar1 + 0x358) = *(int *)((long)pvVar1 + 0xe8) + -1;
  }
  *(undefined1 *)((long)pvVar1 + 0x388) = 0;
  return 0;
}

Assistant:

static int
parse_codes(struct archive_read *a)
{
  int i, j, val, n, r;
  unsigned char bitlengths[MAX_SYMBOLS], zerocount, ppmd_flags;
  unsigned int maxorder;
  struct huffman_code precode;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  free_codes(a);

  /* Skip to the next byte */
  rar_br_consume_unaligned_bits(br);

  /* PPMd block flag */
  if (!rar_br_read_ahead(a, br, 1))
    goto truncated_data;
  if ((rar->is_ppmd_block = rar_br_bits(br, 1)) != 0)
  {
    rar_br_consume(br, 1);
    if (!rar_br_read_ahead(a, br, 7))
      goto truncated_data;
    ppmd_flags = rar_br_bits(br, 7);
    rar_br_consume(br, 7);

    /* Memory is allocated in MB */
    if (ppmd_flags & 0x20)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->dictionary_size = (rar_br_bits(br, 8) + 1) << 20;
      rar_br_consume(br, 8);
    }

    if (ppmd_flags & 0x40)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->ppmd_escape = rar->ppmd7_context.InitEsc = rar_br_bits(br, 8);
      rar_br_consume(br, 8);
    }
    else
      rar->ppmd_escape = 2;

    if (ppmd_flags & 0x20)
    {
      maxorder = (ppmd_flags & 0x1F) + 1;
      if(maxorder > 16)
        maxorder = 16 + (maxorder - 16) * 3;

      if (maxorder == 1)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Truncated RAR file data");
        return (ARCHIVE_FATAL);
      }

      /* Make sure ppmd7_contest is freed before Ppmd7_Construct
       * because reading a broken file cause this abnormal sequence. */
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);

      rar->bytein.a = a;
      rar->bytein.Read = &ppmd_read;
      __archive_ppmd7_functions.PpmdRAR_RangeDec_CreateVTable(&rar->range_dec);
      rar->range_dec.Stream = &rar->bytein;
      __archive_ppmd7_functions.Ppmd7_Construct(&rar->ppmd7_context);

      if (rar->dictionary_size == 0) {
	      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid zero dictionary size");
	      return (ARCHIVE_FATAL);
      }

      if (!__archive_ppmd7_functions.Ppmd7_Alloc(&rar->ppmd7_context,
        rar->dictionary_size))
      {
        archive_set_error(&a->archive, ENOMEM,
                          "Out of memory");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
      __archive_ppmd7_functions.Ppmd7_Init(&rar->ppmd7_context, maxorder);
      rar->ppmd_valid = 1;
    }
    else
    {
      if (!rar->ppmd_valid) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid PPMd sequence");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
    }
  }
  else
  {
    rar_br_consume(br, 1);

    /* Keep existing table flag */
    if (!rar_br_read_ahead(a, br, 1))
      goto truncated_data;
    if (!rar_br_bits(br, 1))
      memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
    rar_br_consume(br, 1);

    memset(&bitlengths, 0, sizeof(bitlengths));
    for (i = 0; i < MAX_SYMBOLS;)
    {
      if (!rar_br_read_ahead(a, br, 4))
        goto truncated_data;
      bitlengths[i++] = rar_br_bits(br, 4);
      rar_br_consume(br, 4);
      if (bitlengths[i-1] == 0xF)
      {
        if (!rar_br_read_ahead(a, br, 4))
          goto truncated_data;
        zerocount = rar_br_bits(br, 4);
        rar_br_consume(br, 4);
        if (zerocount)
        {
          i--;
          for (j = 0; j < zerocount + 2 && i < MAX_SYMBOLS; j++)
            bitlengths[i++] = 0;
        }
      }
    }

    memset(&precode, 0, sizeof(precode));
    r = create_code(a, &precode, bitlengths, MAX_SYMBOLS, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK) {
      free(precode.tree);
      free(precode.table);
      return (r);
    }

    for (i = 0; i < HUFFMAN_TABLE_SIZE;)
    {
      if ((val = read_next_symbol(a, &precode)) < 0) {
        free(precode.tree);
        free(precode.table);
        return (ARCHIVE_FATAL);
      }
      if (val < 16)
      {
        rar->lengthtable[i] = (rar->lengthtable[i] + val) & 0xF;
        i++;
      }
      else if (val < 18)
      {
        if (i == 0)
        {
          free(precode.tree);
          free(precode.table);
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file.");
          return (ARCHIVE_FATAL);
        }

        if(val == 16) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for (j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
        {
          rar->lengthtable[i] = rar->lengthtable[i-1];
          i++;
        }
      }
      else
      {
        if(val == 18) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for(j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
          rar->lengthtable[i++] = 0;
      }
    }
    free(precode.tree);
    free(precode.table);

    r = create_code(a, &rar->maincode, &rar->lengthtable[0], MAINCODE_SIZE,
                MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->offsetcode, &rar->lengthtable[MAINCODE_SIZE],
                OFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lowoffsetcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE],
                LOWOFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lengthcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE +
                LOWOFFSETCODE_SIZE], LENGTHCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
  }

  if (!rar->dictionary_size || !rar->lzss.window)
  {
    /* Seems as though dictionary sizes are not used. Even so, minimize
     * memory usage as much as possible.
     */
    void *new_window;
    unsigned int new_size;

    if (rar->unp_size >= DICTIONARY_MAX_SIZE)
      new_size = DICTIONARY_MAX_SIZE;
    else
      new_size = rar_fls((unsigned int)rar->unp_size) << 1;
    if (new_size == 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Zero window size is invalid.");
      return (ARCHIVE_FATAL);
    }
    new_window = realloc(rar->lzss.window, new_size);
    if (new_window == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
    rar->lzss.window = (unsigned char *)new_window;
    rar->dictionary_size = new_size;
    memset(rar->lzss.window, 0, rar->dictionary_size);
    rar->lzss.mask = rar->dictionary_size - 1;
  }

  rar->start_new_table = 0;
  return (ARCHIVE_OK);
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
}